

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize<char>(FSerializer *arc,char *key,char **pstr,char **def)

{
  bool bVar1;
  int iVar2;
  Value *this;
  Ch *cc;
  char *pcVar3;
  bool local_31;
  Value *val;
  char **def_local;
  char **pstr_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (char **)0x0)) || (iVar2 = strcmp(*pstr,*def), iVar2 != 0)) {
      FSerializer::WriteKey(arc,key);
      if (*pstr == (char *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,*pstr);
      }
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this);
      local_31 = true;
      if (!bVar1) {
        local_31 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsString(this);
      }
      if (local_31 == false) {
        __assert_fail("val->IsNull() || val->IsString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x86f,"FSerializer &Serialize(FSerializer &, const char *, char *&, char **)"
                     );
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this);
      if (bVar1) {
        *pstr = (char *)0x0;
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this);
        if (bVar1) {
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this);
          pcVar3 = UnicodeToString(cc);
          pcVar3 = copystring(pcVar3);
          *pstr = pcVar3;
        }
        else {
          Printf("\x1cGstring expected for \'%s\'",key);
          *pstr = (char *)0x0;
          arc->mErrors = arc->mErrors + 1;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, char *&pstr, char **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || strcmp(pstr, *def))
		{
			arc.WriteKey(key);
			if (pstr == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(pstr);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = nullptr;
			}
			else if (val->IsString())
			{
				pstr = copystring(UnicodeToString(val->GetString()));
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;
}